

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O2

size_t vbmi2_despace(char *bytes,size_t howmany)

{
  undefined8 uVar1;
  size_t sVar2;
  ulong uVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  
  auVar4 = vpbroadcastb_avx512bw(ZEXT116(0x20));
  uVar3 = 0;
  sVar2 = 0;
  while (uVar3 + 0x3f < howmany) {
    auVar5 = vmovdqu64_avx512f(*(undefined1 (*) [64])(bytes + uVar3));
    uVar3 = uVar3 + 0x40;
    uVar1 = vpcmpgtb_avx512bw(auVar5,auVar4);
    auVar5 = vpcompressb_avx512_vbmi2(auVar5,uVar1);
    *(undefined1 (*) [64])(bytes + sVar2) = auVar5;
    sVar2 = sVar2 + POPCOUNT(uVar1);
  }
  for (; uVar3 < howmany; uVar3 = uVar3 + 1) {
    if (' ' < bytes[uVar3]) {
      bytes[sVar2] = bytes[uVar3];
      sVar2 = sVar2 + 1;
    }
  }
  return sVar2;
}

Assistant:

size_t vbmi2_despace(char *bytes, size_t howmany) {
  size_t pos = 0;
  __m512i spaces = _mm512_set1_epi8(' ');
  size_t i = 0;
  for (; i + 63 < howmany; i += 64) {
    __m512i x = _mm512_loadu_si512((const __m512i *)(bytes + i));
    __mmask64  notwhite = _mm512_cmpgt_epi8_mask  (x, spaces);
    _mm512_mask_compressstoreu_epi8  (bytes + pos, notwhite, x);
    pos += _popcnt64(notwhite);
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c <= ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}